

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.cpp
# Opt level: O3

FSerializer * Serialize(FSerializer *arc,char *key,FTextureID *value,FTextureID *defval)

{
  ushort uVar1;
  FWriter *pFVar2;
  FTexture *pFVar3;
  uint uVar4;
  FTextureID FVar5;
  FTexture *pFVar6;
  Value *this;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *this_00;
  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
  *pGVar7;
  Ch *cc;
  char *pcVar8;
  ulong uVar9;
  
  pFVar2 = arc->w;
  if (pFVar2 == (FWriter *)0x0) {
    this = FReader::FindKey(arc->r,key);
    if (this != (Value *)0x0) {
      uVar1 = (this->data_).f.flags;
      if (uVar1 == 0) {
        value->texnum = -1;
      }
      else if (uVar1 == 4) {
        this_00 = rapidjson::
                  GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                  ::operator[](this,0);
        pGVar7 = rapidjson::
                 GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
                 ::operator[](this,1);
        if (((*(byte *)((long)&this_00->data_ + 0x17) & 4) == 0) ||
           ((*(byte *)((long)&pGVar7->data_ + 0x16) & 0x20) == 0)) {
          __assert_fail("nameval.IsString() && typeval.IsInt()",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x607,
                        "FSerializer &Serialize(FSerializer &, const char *, FTextureID &, FTextureID *)"
                       );
        }
        cc = rapidjson::
             GenericValue<rapidjson::UTF8<char>,_rapidjson::MemoryPoolAllocator<rapidjson::CrtAllocator>_>
             ::GetString(this_00);
        pcVar8 = UnicodeToString(cc);
        if ((*(byte *)((long)&pGVar7->data_ + 0x16) & 0x20) == 0) {
          __assert_fail("data_.f.flags & kIntFlag",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/rapidjson/document.h"
                        ,0x66d,
                        "int rapidjson::GenericValue<rapidjson::UTF8<>>::GetInt() const [Encoding = rapidjson::UTF8<>, Allocator = rapidjson::MemoryPoolAllocator<>]"
                       );
        }
        FVar5 = FTextureManager::GetTexture(&TexMan,pcVar8,(pGVar7->data_).s.length,0);
        value->texnum = (int)FVar5;
      }
      else {
        if (((uVar1 & 0x20) == 0) || ((this->data_).s.length != 0)) {
          __assert_fail("false && \"not a texture\"",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/serializer.cpp"
                        ,0x61d,
                        "FSerializer &Serialize(FSerializer &, const char *, FTextureID &, FTextureID *)"
                       );
        }
        value->texnum = 0;
      }
    }
  }
  else {
    uVar4 = (pFVar2->mInObject).Count;
    if (((uVar4 == 0) || (defval == (FTextureID *)0x0)) ||
       ((pFVar2->mInObject).Array[uVar4 - 1] == false)) {
      uVar4 = value->texnum;
    }
    else {
      uVar4 = value->texnum;
      if (uVar4 == defval->texnum) {
        return arc;
      }
    }
    if ((int)uVar4 < 0) {
      FSerializer::WriteKey(arc,key);
      FWriter::Null(arc->w);
    }
    else if (uVar4 == 0) {
      FSerializer::WriteKey(arc,key);
      FWriter::Int(arc->w,0);
    }
    else {
      uVar9 = 0;
      if ((int)uVar4 < (int)TexMan.Textures.Count) {
        uVar9 = (ulong)uVar4;
      }
      pFVar3 = TexMan.Textures.Array[uVar9].Texture;
      pFVar6 = FWadCollection::GetLinkedTexture(&Wads,pFVar3->SourceLump);
      if (pFVar6 == pFVar3) {
        pcVar8 = FWadCollection::GetLumpFullName(&Wads,pFVar3->SourceLump);
      }
      else {
        pcVar8 = (pFVar3->Name).Chars;
      }
      FSerializer::WriteKey(arc,key);
      FWriter::StartArray(arc->w);
      FWriter::String(arc->w,pcVar8);
      FWriter::Int(arc->w,(uint)pFVar3->UseType);
      FWriter::EndArray(arc->w);
    }
  }
  return arc;
}

Assistant:

FSerializer &Serialize(FSerializer &arc, const char *key, FTextureID &value, FTextureID *defval)
{
	if (arc.isWriting())
	{
		if (!arc.w->inObject() || defval == nullptr || value != *defval)
		{
			if (!value.Exists())
			{
				arc.WriteKey(key);
				arc.w->Null();
				return arc;
			}
			if (value.isNull())
			{
				// save 'no texture' in a more space saving way
				arc.WriteKey(key);
				arc.w->Int(0);
				return arc;
			}
			FTextureID chk = value;
			if (chk.GetIndex() >= TexMan.NumTextures()) chk.SetNull();
			FTexture *pic = TexMan[chk];
			const char *name;

			if (Wads.GetLinkedTexture(pic->SourceLump) == pic)
			{
				name = Wads.GetLumpFullName(pic->SourceLump);
			}
			else
			{
				name = pic->Name;
			}
			arc.WriteKey(key);
			arc.w->StartArray();
			arc.w->String(name);
			arc.w->Int(pic->UseType);
			arc.w->EndArray();
		}
	}
	else
	{
		auto val = arc.r->FindKey(key);
		if (val != nullptr)
		{
			if (val->IsArray())
			{
				const rapidjson::Value &nameval = (*val)[0];
				const rapidjson::Value &typeval = (*val)[1];
				assert(nameval.IsString() && typeval.IsInt());
				if (nameval.IsString() && typeval.IsInt())
				{
					value = TexMan.GetTexture(UnicodeToString(nameval.GetString()), typeval.GetInt());
				}
				else
				{
					Printf(TEXTCOLOR_RED "object does not represent a texture for '%s'", key);
					value.SetNull();
					arc.mErrors++;
				}
			}
			else if (val->IsNull())
			{
				value.SetInvalid();
			}
			else if (val->IsInt() && val->GetInt() == 0)
			{
				value.SetNull();
			}
			else
			{
				assert(false && "not a texture");
				Printf(TEXTCOLOR_RED "object does not represent a texture for '%s'", key);
				value.SetNull();
				arc.mErrors++;
			}
		}
	}
	return arc;
}